

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void Liby::Signal::reset(int signo)

{
  int __sig;
  bool bVar1;
  mapped_type *pp_Var2;
  _Node_iterator_base<std::pair<const_int,_void_(*)(int)>,_false> local_40;
  _Node_iterator_base<std::pair<const_int,_void_(*)(int)>,_false> local_38;
  iterator k1;
  _Node_iterator_base<std::pair<const_int,_std::function<void_()>_>,_false> local_20;
  _Node_iterator_base<std::pair<const_int,_std::function<void_()>_>,_false> local_18;
  iterator k;
  int signo_local;
  
  k.super__Node_iterator_base<std::pair<const_int,_std::function<void_()>_>,_false>._M_cur._4_4_ =
       signo;
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::function<void_()>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::function<void_()>_>_>_>
       ::find(&functors,
              (key_type *)
              ((long)&k.
                      super__Node_iterator_base<std::pair<const_int,_std::function<void_()>_>,_false>
                      ._M_cur + 4));
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::function<void_()>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::function<void_()>_>_>_>
       ::end(&functors);
  bVar1 = std::__detail::operator!=(&local_18,&local_20);
  if (bVar1) {
    k1.super__Node_iterator_base<std::pair<const_int,_void_(*)(int)>,_false>._M_cur =
         (_Node_iterator_base<std::pair<const_int,_void_(*)(int)>,_false>)
         std::
         unordered_map<int,_std::function<void_()>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::function<void_()>_>_>_>
         ::erase(&functors,(iterator)local_18._M_cur);
  }
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_void_(*)(int),_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_void_(*)(int)>_>_>
       ::find(&stored_funcs,
              (key_type *)
              ((long)&k.
                      super__Node_iterator_base<std::pair<const_int,_std::function<void_()>_>,_false>
                      ._M_cur + 4));
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_void_(*)(int),_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_void_(*)(int)>_>_>
       ::end(&stored_funcs);
  bVar1 = std::__detail::operator!=(&local_38,&local_40);
  __sig = k.super__Node_iterator_base<std::pair<const_int,_std::function<void_()>_>,_false>._M_cur.
          _4_4_;
  if (bVar1) {
    pp_Var2 = std::
              unordered_map<int,_void_(*)(int),_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_void_(*)(int)>_>_>
              ::operator[](&stored_funcs,
                           (key_type *)
                           ((long)&k.
                                   super__Node_iterator_base<std::pair<const_int,_std::function<void_()>_>,_false>
                                   ._M_cur + 4));
    ::signal(__sig,(__sighandler_t)*pp_Var2);
    std::
    unordered_map<int,_void_(*)(int),_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_void_(*)(int)>_>_>
    ::erase(&stored_funcs,(iterator)local_38._M_cur);
  }
  return;
}

Assistant:

void Signal::reset(int signo) {
    auto k = functors.find(signo);
    if (k != functors.end()) {
        functors.erase(k);
    }
    auto k1 = stored_funcs.find(signo);
    if (k1 != stored_funcs.end()) {
        ::signal(signo, stored_funcs[signo]);
        stored_funcs.erase(k1);
    }
}